

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# randomBuilderCmd.cpp
# Opt level: O0

int cmdline_parser_internal
              (int argc,char **argv,gengetopt_args_info *args_info,cmdline_parser_params *params,
              char *additional_error)

{
  uint uVar1;
  int iVar2;
  void *pvVar3;
  char *pcVar4;
  long in_RCX;
  int iVar5;
  long in_RDX;
  undefined8 *in_RSI;
  int in_EDI;
  char **in_R8;
  int found_prog_name;
  int i;
  int option_index;
  int optopt;
  int opterr;
  int optind;
  char *optarg;
  int check_ambiguity;
  int check_required;
  int initialize;
  int override;
  gengetopt_args_info local_args_info;
  int error_occurred;
  generic_list *molFraction_list;
  int c;
  char *in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe30;
  undefined4 in_stack_fffffffffffffe34;
  char **in_stack_fffffffffffffe38;
  undefined4 uVar6;
  cmdline_parser_arg_type in_stack_fffffffffffffe44;
  undefined4 in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe4c;
  uint in_stack_fffffffffffffe50;
  uint in_stack_fffffffffffffe54;
  char *in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe64;
  generic_list *in_stack_fffffffffffffe70;
  undefined8 in_stack_fffffffffffffe78;
  char *in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe94;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  undefined4 uVar11;
  char *in_stack_fffffffffffffed0;
  char in_stack_fffffffffffffed8;
  char *in_stack_fffffffffffffee0;
  char **in_stack_ffffffffffffff10;
  char *in_stack_ffffffffffffff18;
  uint *in_stack_ffffffffffffff20;
  uint *in_stack_ffffffffffffff28;
  char **in_stack_ffffffffffffff30;
  void *in_stack_ffffffffffffff38;
  char *in_stack_ffffffffffffff50;
  cmdline_parser_arg_type in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff78;
  char *in_stack_ffffffffffffff80;
  char in_stack_ffffffffffffff88;
  char *in_stack_ffffffffffffff90;
  int local_64;
  int local_44;
  char *local_40;
  
  local_40 = (char *)0x0;
  local_44 = 0;
  package_name = (char *)*in_RSI;
  iVar7 = *(int *)(in_RCX + 8);
  uVar11 = *(undefined4 *)(in_RCX + 0xc);
  if (*(int *)(in_RCX + 4) != 0) {
    cmdline_parser_init((gengetopt_args_info *)0x13a8e6);
  }
  cmdline_parser_init((gengetopt_args_info *)0x13a8f3);
  iVar9 = 0x3f;
  iVar5 = *(int *)(in_RCX + 0x10);
  iVar10 = 0;
  pcVar4 = (char *)0x0;
  do {
    do {
      while( true ) {
        custom_optarg = pcVar4;
        custom_optind = iVar10;
        custom_opterr = iVar5;
        custom_optopt = iVar9;
        iVar8 = 0;
        uVar1 = custom_getopt_long(in_stack_fffffffffffffe44,in_stack_fffffffffffffe38,
                                   (char *)CONCAT44(in_stack_fffffffffffffe34,
                                                    in_stack_fffffffffffffe30),
                                   (option *)in_stack_fffffffffffffe28,(int *)0x13a97a);
        if (uVar1 == 0xffffffff) {
          iVar9 = custom_opterr;
          iVar5 = custom_optind;
          pcVar4 = custom_optarg;
          update_multiple_arg((void *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                              (char ***)in_stack_fffffffffffffe58,in_stack_fffffffffffffe54,
                              in_stack_fffffffffffffe50,
                              (generic_value *)
                              CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),
                              in_stack_fffffffffffffe44,in_stack_fffffffffffffe70);
          *(int *)(in_RDX + 0xdc) = local_64 + *(int *)(in_RDX + 0xdc);
          if (iVar7 != 0) {
            local_44 = cmdline_parser_required2
                                 ((gengetopt_args_info *)CONCAT44(iVar7,uVar11),pcVar4,
                                  (char *)CONCAT44(iVar5,iVar9));
          }
          cmdline_parser_release
                    ((gengetopt_args_info *)
                     CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
          if (local_44 != 0) {
            return 1;
          }
          if (iVar5 < in_EDI) {
            iVar7 = 0;
            *(int *)(in_RDX + 0xf0) = in_EDI - iVar5;
            pvVar3 = malloc((ulong)*(uint *)(in_RDX + 0xf0) << 3);
            *(void **)(in_RDX + 0xe8) = pvVar3;
            while (iVar5 < in_EDI) {
              iVar5 = iVar5 + 1;
              pcVar4 = gengetopt_strdup(local_40);
              *(char **)(*(long *)(in_RDX + 0xe8) + (long)iVar7 * 8) = pcVar4;
              iVar7 = iVar7 + 1;
            }
          }
          return 0;
        }
        iVar9 = custom_optopt;
        iVar5 = custom_opterr;
        iVar10 = custom_optind;
        pcVar4 = custom_optarg;
        if (uVar1 == 0) break;
        if (uVar1 == 0x3f) goto LAB_0013b1c8;
        if (uVar1 == 0x56) {
          cmdline_parser_print_version();
          cmdline_parser_free((gengetopt_args_info *)0x13aa3f);
          exit(0);
        }
        if (uVar1 == 0x68) {
          cmdline_parser_print_help();
          cmdline_parser_free((gengetopt_args_info *)0x13aa26);
          exit(0);
        }
        uVar6 = (undefined4)((ulong)in_stack_fffffffffffffe38 >> 0x20);
        if (uVar1 == 0x6c) {
          in_stack_fffffffffffffe28 = (char *)0x0;
          in_stack_fffffffffffffe30 = 1;
          in_stack_fffffffffffffe38 = (char **)CONCAT44(uVar6,uVar11);
          in_stack_fffffffffffffe48 = 0;
          in_stack_fffffffffffffe50 = 0;
          in_stack_fffffffffffffe58 = "lattice";
          in_stack_fffffffffffffe60 = 0x6c;
          iVar8 = update_arg(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
                             in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
                             in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                             in_stack_ffffffffffffff50,in_stack_ffffffffffffff58,
                             in_stack_ffffffffffffff60,in_stack_ffffffffffffff68,
                             in_stack_ffffffffffffff70,in_stack_ffffffffffffff78,
                             in_stack_ffffffffffffff80,in_stack_ffffffffffffff88,
                             in_stack_ffffffffffffff90);
        }
        else {
          if (uVar1 != 0x6f) {
            if (in_R8 == (char **)0x0) {
              in_R8 = (char **)0x43034b;
            }
            fprintf(_stderr,"%s: option unknown: %c%s\n","randomBuilder",(ulong)uVar1,in_R8);
            abort();
          }
          in_stack_fffffffffffffe28 = (char *)0x0;
          in_stack_fffffffffffffe30 = 1;
          in_stack_fffffffffffffe38 = (char **)CONCAT44(uVar6,uVar11);
          in_stack_fffffffffffffe48 = 0;
          in_stack_fffffffffffffe50 = 0;
          in_stack_fffffffffffffe58 = "output";
          in_stack_fffffffffffffe60 = 0x6f;
          iVar8 = update_arg(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
                             in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
                             in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                             in_stack_ffffffffffffff50,in_stack_ffffffffffffff58,
                             in_stack_ffffffffffffff60,in_stack_ffffffffffffff68,
                             in_stack_ffffffffffffff70,in_stack_ffffffffffffff78,
                             in_stack_ffffffffffffff80,in_stack_ffffffffffffff88,
                             in_stack_ffffffffffffff90);
        }
joined_r0x0013af19:
        if (iVar8 != 0) goto LAB_0013b1c8;
      }
      iVar2 = strcmp(cmdline_parser_internal::long_options[iVar8].name,"density");
      if (iVar2 == 0) {
        in_stack_fffffffffffffe28 = (char *)0x0;
        in_stack_fffffffffffffe30 = 3;
        in_stack_fffffffffffffe38 =
             (char **)CONCAT44((int)((ulong)in_stack_fffffffffffffe38 >> 0x20),uVar11);
        in_stack_fffffffffffffe48 = 0;
        in_stack_fffffffffffffe50 = 0;
        in_stack_fffffffffffffe58 = "density";
        in_stack_fffffffffffffe60 = 0x2d;
        iVar8 = update_arg(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
                           in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
                           in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                           in_stack_ffffffffffffff50,in_stack_ffffffffffffff58,
                           in_stack_ffffffffffffff60,in_stack_ffffffffffffff68,
                           in_stack_ffffffffffffff70,in_stack_ffffffffffffff78,
                           in_stack_ffffffffffffff80,in_stack_ffffffffffffff88,
                           in_stack_ffffffffffffff90);
        goto joined_r0x0013af19;
      }
      iVar2 = strcmp(cmdline_parser_internal::long_options[iVar8].name,"nx");
      if (iVar2 == 0) {
        in_stack_fffffffffffffe28 = (char *)0x0;
        in_stack_fffffffffffffe30 = 2;
        in_stack_fffffffffffffe38 =
             (char **)CONCAT44((int)((ulong)in_stack_fffffffffffffe38 >> 0x20),uVar11);
        in_stack_fffffffffffffe48 = 0;
        in_stack_fffffffffffffe50 = 0;
        in_stack_fffffffffffffe58 = "nx";
        in_stack_fffffffffffffe60 = 0x2d;
        iVar8 = update_arg(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
                           in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
                           in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                           in_stack_ffffffffffffff50,in_stack_ffffffffffffff58,
                           in_stack_ffffffffffffff60,in_stack_ffffffffffffff68,
                           in_stack_ffffffffffffff70,in_stack_ffffffffffffff78,
                           in_stack_ffffffffffffff80,in_stack_ffffffffffffff88,
                           in_stack_ffffffffffffff90);
        goto joined_r0x0013af19;
      }
      iVar2 = strcmp(cmdline_parser_internal::long_options[iVar8].name,"ny");
      if (iVar2 == 0) {
        in_stack_fffffffffffffe28 = (char *)0x0;
        in_stack_fffffffffffffe30 = 2;
        in_stack_fffffffffffffe38 =
             (char **)CONCAT44((int)((ulong)in_stack_fffffffffffffe38 >> 0x20),uVar11);
        in_stack_fffffffffffffe48 = 0;
        in_stack_fffffffffffffe50 = 0;
        in_stack_fffffffffffffe58 = "ny";
        in_stack_fffffffffffffe60 = 0x2d;
        iVar8 = update_arg(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
                           in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
                           in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                           in_stack_ffffffffffffff50,in_stack_ffffffffffffff58,
                           in_stack_ffffffffffffff60,in_stack_ffffffffffffff68,
                           in_stack_ffffffffffffff70,in_stack_ffffffffffffff78,
                           in_stack_ffffffffffffff80,in_stack_ffffffffffffff88,
                           in_stack_ffffffffffffff90);
        goto joined_r0x0013af19;
      }
      iVar2 = strcmp(cmdline_parser_internal::long_options[iVar8].name,"nz");
      if (iVar2 == 0) {
        in_stack_fffffffffffffe28 = (char *)0x0;
        in_stack_fffffffffffffe30 = 2;
        in_stack_fffffffffffffe38 =
             (char **)CONCAT44((int)((ulong)in_stack_fffffffffffffe38 >> 0x20),uVar11);
        in_stack_fffffffffffffe48 = 0;
        in_stack_fffffffffffffe50 = 0;
        in_stack_fffffffffffffe58 = "nz";
        in_stack_fffffffffffffe60 = 0x2d;
        iVar8 = update_arg(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
                           in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
                           in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                           in_stack_ffffffffffffff50,in_stack_ffffffffffffff58,
                           in_stack_ffffffffffffff60,in_stack_ffffffffffffff68,
                           in_stack_ffffffffffffff70,in_stack_ffffffffffffff78,
                           in_stack_ffffffffffffff80,in_stack_ffffffffffffff88,
                           in_stack_ffffffffffffff90);
        goto joined_r0x0013af19;
      }
      iVar2 = strcmp(cmdline_parser_internal::long_options[iVar8].name,"molFraction");
    } while (iVar2 != 0);
    in_stack_fffffffffffffe28 = "molFraction";
    in_stack_fffffffffffffe30 = 0x2d;
    in_stack_fffffffffffffe38 = in_R8;
    iVar8 = update_multiple_arg_temp
                      ((generic_list **)CONCAT44(iVar10,iVar5),(uint *)CONCAT44(iVar9,iVar8),
                       (char *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                       (char **)CONCAT44(uVar1,in_stack_fffffffffffffe88),in_stack_fffffffffffffe80,
                       (cmdline_parser_arg_type)((ulong)in_stack_fffffffffffffe78 >> 0x20),
                       in_stack_fffffffffffffed0,in_stack_fffffffffffffed8,in_stack_fffffffffffffee0
                      );
  } while (iVar8 == 0);
LAB_0013b1c8:
  free_list((generic_list *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
            (short)((ulong)in_stack_fffffffffffffe28 >> 0x30));
  cmdline_parser_release
            ((gengetopt_args_info *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
  return 1;
}

Assistant:

int
cmdline_parser_internal (
  int argc, char **argv, struct gengetopt_args_info *args_info,
                        struct cmdline_parser_params *params, const char *additional_error)
{
  int c;	/* Character of the parsed option.  */

  struct generic_list * molFraction_list = NULL;
  int error_occurred = 0;
  struct gengetopt_args_info local_args_info;
  
  int override;
  int initialize;
  int check_required;
  int check_ambiguity;

  char *optarg;
  int optind;
  int opterr;
  int optopt;
  
  package_name = argv[0];
  
  override = params->override;
  initialize = params->initialize;
  check_required = params->check_required;
  check_ambiguity = params->check_ambiguity;

  if (initialize)
    cmdline_parser_init (args_info);

  cmdline_parser_init (&local_args_info);

  optarg = 0;
  optind = 0;
  opterr = params->print_errors;
  optopt = '?';

  while (1)
    {
      int option_index = 0;

      static struct option long_options[] = {
        { "help",	0, NULL, 'h' },
        { "version",	0, NULL, 'V' },
        { "output",	1, NULL, 'o' },
        { "density",	1, NULL, 0 },
        { "nx",	1, NULL, 0 },
        { "ny",	1, NULL, 0 },
        { "nz",	1, NULL, 0 },
        { "molFraction",	1, NULL, 0 },
        { "lattice",	1, NULL, 'l' },
        { 0,  0, 0, 0 }
      };

      custom_optarg = optarg;
      custom_optind = optind;
      custom_opterr = opterr;
      custom_optopt = optopt;

      c = custom_getopt_long (argc, argv, "hVo:l:", long_options, &option_index);

      optarg = custom_optarg;
      optind = custom_optind;
      opterr = custom_opterr;
      optopt = custom_optopt;

      if (c == -1) break;	/* Exit from `while (1)' loop.  */

      switch (c)
        {
        case 'h':	/* Print help and exit.  */
          cmdline_parser_print_help ();
          cmdline_parser_free (&local_args_info);
          exit (EXIT_SUCCESS);

        case 'V':	/* Print version and exit.  */
          cmdline_parser_print_version ();
          cmdline_parser_free (&local_args_info);
          exit (EXIT_SUCCESS);

        case 'o':	/* Output file name.  */
        
        
          if (update_arg( (void *)&(args_info->output_arg), 
               &(args_info->output_orig), &(args_info->output_given),
              &(local_args_info.output_given), optarg, 0, 0, ARG_STRING,
              check_ambiguity, override, 0, 0,
              "output", 'o',
              additional_error))
            goto failure;
        
          break;
        case 'l':	/* Lattice Type.  */
        
        
          if (update_arg( (void *)&(args_info->lattice_arg), 
               &(args_info->lattice_orig), &(args_info->lattice_given),
              &(local_args_info.lattice_given), optarg, cmdline_parser_lattice_values, 0, ARG_STRING,
              check_ambiguity, override, 0, 0,
              "lattice", 'l',
              additional_error))
            goto failure;
        
          break;

        case 0:	/* Long option with no short option */
          /* density (g/cm^3).  */
          if (strcmp (long_options[option_index].name, "density") == 0)
          {
          
          
            if (update_arg( (void *)&(args_info->density_arg), 
                 &(args_info->density_orig), &(args_info->density_given),
                &(local_args_info.density_given), optarg, 0, 0, ARG_DOUBLE,
                check_ambiguity, override, 0, 0,
                "density", '-',
                additional_error))
              goto failure;
          
          }
          /* number of unit cells in x.  */
          else if (strcmp (long_options[option_index].name, "nx") == 0)
          {
          
          
            if (update_arg( (void *)&(args_info->nx_arg), 
                 &(args_info->nx_orig), &(args_info->nx_given),
                &(local_args_info.nx_given), optarg, 0, 0, ARG_INT,
                check_ambiguity, override, 0, 0,
                "nx", '-',
                additional_error))
              goto failure;
          
          }
          /* number of unit cells in y.  */
          else if (strcmp (long_options[option_index].name, "ny") == 0)
          {
          
          
            if (update_arg( (void *)&(args_info->ny_arg), 
                 &(args_info->ny_orig), &(args_info->ny_given),
                &(local_args_info.ny_given), optarg, 0, 0, ARG_INT,
                check_ambiguity, override, 0, 0,
                "ny", '-',
                additional_error))
              goto failure;
          
          }
          /* number of unit cells in z.  */
          else if (strcmp (long_options[option_index].name, "nz") == 0)
          {
          
          
            if (update_arg( (void *)&(args_info->nz_arg), 
                 &(args_info->nz_orig), &(args_info->nz_given),
                &(local_args_info.nz_given), optarg, 0, 0, ARG_INT,
                check_ambiguity, override, 0, 0,
                "nz", '-',
                additional_error))
              goto failure;
          
          }
          /* (Default) Builds a multi-component random mixed nanoparticle. Mole Fraction must be specified for each componet > 1 in MD file..  */
          else if (strcmp (long_options[option_index].name, "molFraction") == 0)
          {
          
            if (update_multiple_arg_temp(&molFraction_list, 
                &(local_args_info.molFraction_given), optarg, 0, 0, ARG_DOUBLE,
                "molFraction", '-',
                additional_error))
              goto failure;
          
          }
          
          break;
        case '?':	/* Invalid option.  */
          /* `getopt_long' already printed an error message.  */
          goto failure;

        default:	/* bug: option not considered.  */
          fprintf (stderr, "%s: option unknown: %c%s\n", CMDLINE_PARSER_PACKAGE, c, (additional_error ? additional_error : ""));
          abort ();
        } /* switch */
    } /* while */


  update_multiple_arg((void *)&(args_info->molFraction_arg),
    &(args_info->molFraction_orig), args_info->molFraction_given,
    local_args_info.molFraction_given, 0,
    ARG_DOUBLE, molFraction_list);

  args_info->molFraction_given += local_args_info.molFraction_given;
  local_args_info.molFraction_given = 0;
  
  if (check_required)
    {
      error_occurred += cmdline_parser_required2 (args_info, argv[0], additional_error);
    }

  cmdline_parser_release (&local_args_info);

  if ( error_occurred )
    return (EXIT_FAILURE);

  if (optind < argc)
    {
      int i = 0 ;
      int found_prog_name = 0;
      /* whether program name, i.e., argv[0], is in the remaining args
         (this may happen with some implementations of getopt,
          but surely not with the one included by gengetopt) */


      args_info->inputs_num = argc - optind - found_prog_name;
      args_info->inputs =
        (char **)(malloc ((args_info->inputs_num)*sizeof(char *))) ;
      while (optind < argc)
        args_info->inputs[ i++ ] = gengetopt_strdup (argv[optind++]) ;
    }

  return 0;

failure:
  free_list (molFraction_list, 0 );
  
  cmdline_parser_release (&local_args_info);
  return (EXIT_FAILURE);
}